

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafeTest_StopImmediatelyAfterStarting_Test::TestBody
          (CommissionerSafeTest_StopImmediatelyAfterStarting_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_1d0;
  Message local_1c8;
  ErrorCode local_1bc;
  Error local_1b8;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  Message local_178;
  void *local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  shared_ptr<ot::commissioner::Commissioner> commissioner;
  undefined1 local_118 [8];
  Config config;
  CommissionerHandler dummyHandler;
  CommissionerSafeTest_StopImmediatelyAfterStarting_Test *this_local;
  
  CommissionerHandler::CommissionerHandler
            ((CommissionerHandler *)((long)&config.mThreadSMRoot.field_2 + 8));
  Config::Config((Config *)local_118);
  local_118[0] = false;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._1_1_ = 0x11;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._2_1_ = 0x22;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0x33;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_1_ = 0x44;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._5_1_ = 0x55;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = 0x66;
  commissioner.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0x77;
  __l._M_len = 0x10;
  __l._M_array = (iterator)
                 &commissioner.
                  super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&config.mId.field_2 + 8),__l);
  Commissioner::Create
            ((Commissioner *)&gtest_ar.message_,
             (CommissionerHandler *)((long)&config.mThreadSMRoot.field_2 + 8));
  local_170 = (void *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::Commissioner>,decltype(nullptr)>
            ((internal *)local_168,"commissioner","nullptr",
             (shared_ptr<ot::commissioner::Commissioner> *)&gtest_ar.message_,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe_test.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  (*peVar3->_vptr_Commissioner[2])(&local_1b8,peVar3,local_118);
  local_1bc = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_190,"commissioner->Init(config)","ErrorCode::kNone",&local_1b8,
             &local_1bc);
  Error::~Error(&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe_test.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::shared_ptr<ot::commissioner::Commissioner>::~shared_ptr
            ((shared_ptr<ot::commissioner::Commissioner> *)&gtest_ar.message_);
  Config::~Config((Config *)local_118);
  CommissionerHandler::~CommissionerHandler
            ((CommissionerHandler *)((long)&config.mThreadSMRoot.field_2 + 8));
  return;
}

Assistant:

TEST(CommissionerSafeTest, StopImmediatelyAfterStarting)
{
    CommissionerHandler dummyHandler;

    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    // This creates an CommissionerSafe instance.
    auto commissioner = Commissioner::Create(dummyHandler);
    EXPECT_NE(commissioner, nullptr);
    EXPECT_EQ(commissioner->Init(config), ErrorCode::kNone);
}